

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrImage.c
# Opt level: O1

Bbr_ImageTree_t *
Bbr_bddImageStart(DdManager *dd,DdNode *bCare,int nParts,DdNode **pbParts,int nVars,DdNode **pbVars,
                 int nBddMax,int fVerbose)

{
  size_t __size;
  DdHalfWord DVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  void *pvVar5;
  int *piVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  DdNode *bTemp;
  DdNode *pDVar10;
  DdNode *pDVar11;
  long lVar12;
  void *__ptr;
  undefined8 *puVar13;
  DdNode **ppDVar14;
  ulong uVar15;
  DdNode *pDVar16;
  void *__s;
  DdHalfWord *pDVar17;
  void *__ptr_00;
  Bbr_ImageNode_t *pBVar18;
  Bbr_ImageNode_t *pBVar19;
  Bbr_ImageTree_t *pBVar20;
  Bbr_ImageNode_t *pBVar21;
  int iVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  ulong uVar28;
  DdNode *f;
  size_t __size_00;
  ulong uVar29;
  double dVar30;
  double dVar31;
  
  if ((fVerbose != 0) && (dd->size < 0x51)) {
    pDVar10 = Cudd_Support(dd,bCare);
    Cudd_Ref(pDVar10);
    pDVar11 = Cudd_bddComputeCube(dd,pbVars,(int *)0x0,nVars);
    Cudd_Ref(pDVar11);
    puts("The latch dependency matrix:");
    printf("Partitions = %d   Variables: total = %d  non-quantifiable = %d\n",(ulong)(uint)nParts,
           (ulong)(uint)dd->size,(ulong)(uint)nVars);
    printf("     : ");
    if (0 < dd->size) {
      uVar25 = 0;
      do {
        printf("%d",(ulong)(uVar25 % 10));
        uVar25 = uVar25 + 1;
      } while ((int)uVar25 < dd->size);
    }
    putchar(10);
    if (0 < nParts) {
      uVar28 = 0;
      do {
        Bbr_bddImagePrintLatchDependencyOne(dd,pbParts[uVar28],pDVar10,pDVar11,(int)uVar28);
        uVar28 = uVar28 + 1;
      } while ((uint)nParts != uVar28);
    }
    Bbr_bddImagePrintLatchDependencyOne(dd,bCare,pDVar10,pDVar11,nParts);
    Cudd_RecursiveDeref(dd,pDVar10);
    Cudd_RecursiveDeref(dd,pDVar11);
  }
  lVar12 = (long)nParts;
  __size = lVar12 * 8 + 8;
  __ptr = malloc(__size);
  if (0 < nParts) {
    uVar28 = 0;
    do {
      puVar13 = (undefined8 *)malloc(0x18);
      *(undefined8 **)((long)__ptr + uVar28 * 8) = puVar13;
      pDVar10 = pbParts[uVar28];
      *puVar13 = pDVar10;
      Cudd_Ref(pDVar10);
      pDVar10 = Cudd_Support(dd,(DdNode *)*puVar13);
      puVar13[1] = pDVar10;
      Cudd_Ref(pDVar10);
      iVar8 = Cudd_SupportSize(dd,(DdNode *)puVar13[1]);
      *(short *)((long)puVar13 + 0x14) = (short)iVar8;
      iVar8 = Cudd_DagSize((DdNode *)*puVar13);
      *(int *)(puVar13 + 2) = iVar8;
      *(short *)((long)puVar13 + 0x16) = (short)uVar28;
      uVar28 = uVar28 + 1;
    } while ((uint)nParts != uVar28);
  }
  puVar13 = (undefined8 *)malloc(0x18);
  *(undefined8 **)((long)__ptr + lVar12 * 8) = puVar13;
  *puVar13 = bCare;
  Cudd_Ref(bCare);
  pDVar10 = Cudd_Support(dd,(DdNode *)*puVar13);
  puVar13[1] = pDVar10;
  Cudd_Ref(pDVar10);
  iVar8 = Cudd_SupportSize(dd,(DdNode *)puVar13[1]);
  *(short *)((long)puVar13 + 0x14) = (short)iVar8;
  iVar8 = Cudd_DagSize((DdNode *)*puVar13);
  *(int *)(puVar13 + 2) = iVar8;
  *(short *)((long)puVar13 + 0x16) = (short)nParts;
  ppDVar14 = (DdNode **)malloc(__size);
  uVar28 = (ulong)(nParts + 1U);
  if (-1 < nParts) {
    uVar15 = 0;
    do {
      ppDVar14[uVar15] = *(DdNode **)(*(long *)((long)__ptr + uVar15 * 8) + 8);
      uVar15 = uVar15 + 1;
    } while (uVar28 != uVar15);
  }
  pDVar10 = Cudd_VectorSupport(dd,ppDVar14,nParts + 1U);
  Cudd_Ref(pDVar10);
  if (ppDVar14 != (DdNode **)0x0) {
    free(ppDVar14);
  }
  pDVar11 = Cudd_bddComputeCube(dd,pbVars,(int *)0x0,nVars);
  Cudd_Ref(pDVar11);
  pDVar16 = Cudd_bddExistAbstract(dd,pDVar10,pDVar11);
  Cudd_Ref(pDVar16);
  Cudd_RecursiveDeref(dd,pDVar10);
  Cudd_RecursiveDeref(dd,pDVar11);
  Cudd_SupportSize(dd,pDVar16);
  __size_00 = (long)dd->size << 3;
  __s = malloc(__size_00);
  memset(__s,0,__size_00);
  pDVar11 = dd->one;
  pDVar10 = pDVar16;
  if (pDVar16 != pDVar11) {
    do {
      DVar1 = pDVar10->index;
      pDVar17 = (DdHalfWord *)malloc(0x18);
      *(DdHalfWord **)((long)__s + (long)(int)DVar1 * 8) = pDVar17;
      *pDVar17 = DVar1;
      Cudd_Ref(pDVar11);
      if (nParts < 0) {
        iVar8 = 0;
      }
      else {
        uVar15 = 0;
        iVar8 = 0;
        f = pDVar11;
        do {
          iVar9 = Cudd_bddLeq(dd,*(DdNode **)(*(long *)((long)__ptr + uVar15 * 8) + 8),
                              dd->vars[pDVar10->index]);
          pDVar11 = f;
          if (iVar9 != 0) {
            pDVar11 = Cudd_bddAnd(dd,f,dd->vars[uVar15]);
            Cudd_Ref(pDVar11);
            Cudd_RecursiveDeref(dd,f);
            iVar8 = iVar8 + 1;
          }
          uVar15 = uVar15 + 1;
          f = pDVar11;
        } while (uVar28 != uVar15);
      }
      lVar4 = *(long *)((long)__s + (long)(int)DVar1 * 8);
      *(DdNode **)(lVar4 + 8) = pDVar11;
      *(int *)(lVar4 + 0x10) = iVar8;
      pDVar10 = (pDVar10->type).kids.T;
      pDVar11 = dd->one;
    } while (pDVar10 != pDVar11);
  }
  Cudd_RecursiveDeref(dd,pDVar16);
  uVar25 = dd->size;
  __ptr_00 = malloc(__size);
  if (-1 < nParts) {
    uVar15 = 0;
    do {
      puVar13 = (undefined8 *)malloc(0x30);
      *(undefined8 **)((long)__ptr_00 + uVar15 * 8) = puVar13;
      *puVar13 = 0;
      puVar13[1] = 0;
      puVar13[2] = 0;
      puVar13[3] = 0;
      puVar13[4] = 0;
      puVar13[5] = 0;
      *puVar13 = dd;
      puVar13[5] = *(undefined8 *)((long)__ptr + uVar15 * 8);
      uVar15 = uVar15 + 1;
    } while (uVar28 != uVar15);
  }
  if (0 < (int)uVar25) {
    uVar15 = 0;
    do {
      pvVar5 = *(void **)((long)__s + uVar15 * 8);
      if (pvVar5 != (void *)0x0) {
        if (*(int *)((long)pvVar5 + 0x10) < 1) {
          __assert_fail("pVars[v]->nParts > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/bbr/bbrImage.c"
                        ,0x21a,
                        "Bbr_ImageNode_t **Bbr_CreateNodes(DdManager *, int, Bbr_ImagePart_t **, int, Bbr_ImageVar_t **)"
                       );
        }
        if (*(int *)((long)pvVar5 + 0x10) == 1) {
          lVar4 = *(long *)((long)__ptr_00 + (long)**(int **)((long)pvVar5 + 8) * 8);
          pDVar10 = *(DdNode **)(lVar4 + 8);
          ppDVar14 = dd->vars;
          pDVar11 = ppDVar14[uVar15];
          if (pDVar10 == (DdNode *)0x0) {
            *(DdNode **)(lVar4 + 8) = pDVar11;
            Cudd_Ref(ppDVar14[uVar15]);
          }
          else {
            pDVar11 = Cudd_bddAnd(dd,pDVar10,pDVar11);
            *(DdNode **)(lVar4 + 8) = pDVar11;
            Cudd_Ref(pDVar11);
            Cudd_RecursiveDeref(dd,pDVar10);
          }
          Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar5 + 8));
          free(pvVar5);
          *(undefined8 *)((long)__s + uVar15 * 8) = 0;
        }
      }
      uVar15 = uVar15 + 1;
    } while (uVar25 != uVar15);
  }
  if (-1 < nParts) {
    uVar15 = 0;
    do {
      lVar4 = *(long *)((long)__ptr_00 + uVar15 * 8);
      if (*(DdNode **)(lVar4 + 8) != (DdNode *)0x0) {
        puVar13 = *(undefined8 **)((long)__ptr + uVar15 * 8);
        pDVar10 = (DdNode *)*puVar13;
        pDVar11 = Cudd_bddExistAbstract(dd,pDVar10,*(DdNode **)(lVar4 + 8));
        *puVar13 = pDVar11;
        Cudd_Ref(pDVar11);
        Cudd_RecursiveDeref(dd,pDVar10);
        pDVar10 = (DdNode *)puVar13[1];
        pDVar11 = Cudd_bddExistAbstract(dd,pDVar10,*(DdNode **)(lVar4 + 8));
        puVar13[1] = pDVar11;
        Cudd_Ref(pDVar11);
        Cudd_RecursiveDeref(dd,pDVar10);
        iVar8 = Cudd_SupportSize(dd,(DdNode *)puVar13[1]);
        *(short *)((long)puVar13 + 0x14) = (short)iVar8;
        iVar8 = Cudd_DagSize((DdNode *)*puVar13);
        *(int *)(puVar13 + 2) = iVar8;
        if ((long)uVar15 < lVar12) {
          Cudd_RecursiveDeref(dd,*(DdNode **)(lVar4 + 8));
          *(undefined8 *)(lVar4 + 8) = 0;
        }
      }
      pDVar10 = (DdNode *)**(undefined8 **)((long)__ptr + uVar15 * 8);
      *(DdNode **)(lVar4 + 0x10) = pDVar10;
      Cudd_Ref(pDVar10);
      uVar15 = uVar15 + 1;
    } while (uVar28 != uVar15);
  }
  pBVar21 = *(Bbr_ImageNode_t **)((long)__ptr_00 + lVar12 * 8);
  pBVar19 = pBVar21;
  do {
    iVar8 = dd->size;
    uVar15 = (ulong)iVar8;
    uVar29 = 0xffffffff;
    if ((long)uVar15 < 1) {
      dVar30 = 100000000000000.0;
    }
    else {
      uVar23 = 0;
      dVar30 = 100000000000000.0;
      do {
        lVar12 = *(long *)((long)__s + uVar23 * 8);
        if ((lVar12 != 0) && (*(int *)(lVar12 + 0x10) == 2)) {
          dVar31 = 0.0;
          for (pDVar10 = *(DdNode **)(lVar12 + 8); pDVar10 != dd->one;
              pDVar10 = (pDVar10->type).kids.T) {
            iVar9 = *(int *)(*(long *)(*(long *)((long)__ptr_00 + (ulong)pDVar10->index * 8) + 0x28)
                            + 0x10);
            dVar31 = dVar31 + (double)(iVar9 * iVar9);
          }
          if (dVar31 < dVar30) {
            uVar29 = uVar23 & 0xffffffff;
            dVar30 = dVar31;
          }
        }
        uVar23 = uVar23 + 1;
      } while (uVar23 != uVar15);
    }
    if ((0 < iVar8) && ((int)uVar29 < 0)) {
      uVar23 = 0;
      do {
        lVar12 = *(long *)((long)__s + uVar23 * 8);
        if (lVar12 != 0) {
          if (*(int *)(lVar12 + 0x10) < 2) {
            __assert_fail("pVars[v]->nParts > 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/bbr/bbrImage.c"
                          ,0x3d9,
                          "int Bbr_FindBestVariable(DdManager *, int, Bbr_ImageNode_t **, int, Bbr_ImageVar_t **)"
                         );
          }
          dVar31 = 0.0;
          for (pDVar10 = *(DdNode **)(lVar12 + 8); pDVar10 != dd->one;
              pDVar10 = (pDVar10->type).kids.T) {
            iVar9 = *(int *)(*(long *)(*(long *)((long)__ptr_00 + (ulong)pDVar10->index * 8) + 0x28)
                            + 0x10);
            dVar31 = dVar31 + (double)(iVar9 * iVar9);
          }
          if (dVar31 < dVar30) {
            uVar29 = uVar23 & 0xffffffff;
            dVar30 = dVar31;
          }
        }
        uVar23 = uVar23 + 1;
      } while (uVar23 != uVar15);
    }
    if ((int)uVar29 == -1) {
      bVar7 = true;
    }
    else {
      lVar12 = (long)(int)uVar29;
      piVar6 = *(int **)((long)__s + lVar12 * 8);
      iVar9 = Cudd_SupportSize(dd,*(DdNode **)(piVar6 + 2));
      if (iVar9 != piVar6[4]) {
        __assert_fail("nSupp == pVar->nParts",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/bbr/bbrImage.c"
                      ,0x2f1,
                      "int Bbr_BuildTreeNode(DdManager *, int, Bbr_ImageNode_t **, int, Bbr_ImageVar_t **, int *, int)"
                     );
      }
      if (iVar9 == 1) {
        __assert_fail("nSupp != 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/bbr/bbrImage.c"
                      ,0x2f2,
                      "int Bbr_BuildTreeNode(DdManager *, int, Bbr_ImageNode_t **, int, Bbr_ImageVar_t **, int *, int)"
                     );
      }
      pDVar10 = *(DdNode **)(piVar6 + 2);
      if (piVar6[4] == 2) {
        uVar25 = pDVar10->index;
        uVar24 = ((pDVar10->type).kids.T)->index;
        pBVar18 = *(Bbr_ImageNode_t **)((long)__ptr_00 + (long)(int)uVar25 * 8);
        pBVar19 = *(Bbr_ImageNode_t **)((long)__ptr_00 + (long)(int)uVar24 * 8);
        pDVar10 = dd->vars[*piVar6];
        Cudd_Ref(pDVar10);
        if (0 < iVar8) {
          uVar23 = 0;
          do {
            if (((uVar29 != uVar23) &&
                (piVar6 = *(int **)((long)__s + uVar23 * 8), piVar6 != (int *)0x0)) &&
               (*(long *)(piVar6 + 2) == *(long *)(*(long *)((long)__s + lVar12 * 8) + 8))) {
              pDVar11 = Cudd_bddAnd(dd,pDVar10,dd->vars[*piVar6]);
              Cudd_Ref(pDVar11);
              Cudd_RecursiveDeref(dd,pDVar10);
              pvVar5 = *(void **)((long)__s + uVar23 * 8);
              Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar5 + 8));
              pDVar10 = pDVar11;
              if (pvVar5 != (void *)0x0) {
                free(pvVar5);
                *(undefined8 *)((long)__s + uVar23 * 8) = 0;
              }
            }
            uVar23 = uVar23 + 1;
          } while (uVar15 != uVar23);
        }
        pvVar5 = *(void **)((long)__s + lVar12 * 8);
        Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar5 + 8));
        if (pvVar5 != (void *)0x0) {
          free(pvVar5);
          *(undefined8 *)((long)__s + lVar12 * 8) = 0;
        }
        pBVar18 = Bbr_CombineTwoNodes(dd,pDVar10,pBVar18,pBVar19);
        Cudd_RecursiveDeref(dd,pDVar10);
      }
      else {
        pDVar11 = dd->one;
        if (pDVar11 == pDVar10) {
          uVar25 = 0xffffffff;
          uVar24 = 0xffffffff;
        }
        else {
          uVar25 = 0xffffffff;
          iVar8 = 1000000;
          iVar9 = 1000000;
          uVar26 = 0xffffffff;
          do {
            uVar2 = pDVar10->index;
            iVar3 = *(int *)(*(long *)(*(long *)((long)__ptr_00 + (ulong)uVar2 * 8) + 0x28) + 0x10);
            iVar27 = iVar3;
            iVar22 = iVar8;
            uVar24 = uVar25;
            if (iVar8 <= iVar3) {
              uVar24 = uVar26;
              if (iVar3 < iVar9) {
                uVar24 = uVar2;
              }
              iVar27 = iVar8;
              iVar22 = iVar3;
              uVar2 = uVar25;
              if (iVar9 < iVar3) {
                iVar22 = iVar9;
              }
            }
            uVar25 = uVar2;
            pDVar10 = (pDVar10->type).kids.T;
            iVar8 = iVar27;
            iVar9 = iVar22;
            uVar26 = uVar24;
          } while (pDVar10 != pDVar11);
        }
        pBVar19 = *(Bbr_ImageNode_t **)((long)__ptr_00 + (long)(int)uVar24 * 8);
        pBVar18 = Bbr_CombineTwoNodes(dd,pDVar11,
                                      *(Bbr_ImageNode_t **)((long)__ptr_00 + (long)(int)uVar25 * 8),
                                      pBVar19);
      }
      *(Bbr_ImageNode_t **)((long)__ptr_00 + (long)(int)uVar25 * 8) = pBVar18;
      lVar12 = (long)(int)uVar24;
      *(undefined8 *)((long)__ptr_00 + lVar12 * 8) = 0;
      pDVar10 = pBVar19->pPart->bSupp;
      if (pDVar10 != dd->one) {
        do {
          lVar4 = *(long *)((long)__s + (ulong)pDVar10->index * 8);
          if (lVar4 != 0) {
            iVar8 = Cudd_bddLeq(dd,*(DdNode **)(lVar4 + 8),dd->vars[lVar12]);
            if (iVar8 == 0) {
              __assert_fail("Cudd_bddLeq( dd, pVar->bParts, dd->vars[iNode2] )",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/bbr/bbrImage.c"
                            ,0x333,
                            "int Bbr_BuildTreeNode(DdManager *, int, Bbr_ImageNode_t **, int, Bbr_ImageVar_t **, int *, int)"
                           );
            }
            pDVar11 = *(DdNode **)(lVar4 + 8);
            pDVar16 = Cudd_bddExistAbstract(dd,pDVar11,dd->vars[lVar12]);
            *(DdNode **)(lVar4 + 8) = pDVar16;
            Cudd_Ref(pDVar16);
            Cudd_RecursiveDeref(dd,pDVar11);
            pDVar11 = *(DdNode **)(lVar4 + 8);
            pDVar16 = Cudd_bddAnd(dd,pDVar11,dd->vars[(int)uVar25]);
            *(DdNode **)(lVar4 + 8) = pDVar16;
            Cudd_Ref(pDVar16);
            Cudd_RecursiveDeref(dd,pDVar11);
            iVar8 = Cudd_SupportSize(dd,*(DdNode **)(lVar4 + 8));
            *(int *)(lVar4 + 0x10) = iVar8;
          }
          pDVar10 = (pDVar10->type).kids.T;
        } while (pDVar10 != dd->one);
      }
      bVar7 = (uint)nBddMax < dd->keys - dd->dead;
      pBVar19 = (Bbr_ImageNode_t *)(ulong)bVar7;
    }
  } while (!bVar7);
  uVar25 = dd->size;
  if ((int)pBVar19 == 0) {
    if (0 < (int)uVar25) {
      uVar15 = 0;
      do {
        if (*(long *)((long)__s + uVar15 * 8) != 0) {
          __assert_fail("pVars[v] == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/bbr/bbrImage.c"
                        ,0xd3,
                        "Bbr_ImageTree_t *Bbr_bddImageStart(DdManager *, DdNode *, int, DdNode **, int, DdNode **, int, int)"
                       );
        }
        uVar15 = uVar15 + 1;
      } while (uVar25 != uVar15);
    }
    if (__s != (void *)0x0) {
      free(__s);
    }
    pBVar20 = (Bbr_ImageTree_t *)malloc(0x30);
    pBVar20->pRoot = (Bbr_ImageNode_t *)0x0;
    pBVar20->pCare = (Bbr_ImageNode_t *)0x0;
    pBVar20->nNodesMaxT = 0;
    pBVar20->nIter = 0;
    *(undefined8 *)&pBVar20->nBddMax = 0;
    pBVar20->bCareSupp = (DdNode *)0x0;
    pBVar20->fVerbose = 0;
    pBVar20->nNodesMax = 0;
    pBVar20->pCare = pBVar21;
    pBVar20->nBddMax = nBddMax;
    pBVar20->fVerbose = fVerbose;
    do {
      if (nParts < 0) {
        iVar8 = -1;
      }
      else {
        iVar8 = -1;
        uVar15 = 0;
        do {
          if (*(long *)((long)__ptr_00 + uVar15 * 8) != 0) {
            if (iVar8 != -1) goto LAB_007c4ea4;
            iVar8 = (int)uVar15;
          }
          uVar15 = uVar15 + 1;
        } while (uVar28 != uVar15);
      }
      uVar15 = 0xffffffff;
LAB_007c4ea4:
      if (iVar8 == -1) {
        __assert_fail("n1 != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/bbr/bbrImage.c"
                      ,0x364,
                      "Bbr_ImageNode_t *Bbr_MergeTopNodes(DdManager *, int, Bbr_ImageNode_t **)");
      }
      lVar12 = (long)iVar8;
      iVar8 = (int)uVar15;
      if (iVar8 == -1) {
        pBVar21 = *(Bbr_ImageNode_t **)((long)__ptr_00 + lVar12 * 8);
      }
      else {
        pBVar21 = Bbr_CombineTwoNodes(dd,dd->one,*(Bbr_ImageNode_t **)((long)__ptr_00 + lVar12 * 8),
                                      *(Bbr_ImageNode_t **)((long)__ptr_00 + (long)iVar8 * 8));
        *(Bbr_ImageNode_t **)((long)__ptr_00 + lVar12 * 8) = pBVar21;
        pBVar21 = (Bbr_ImageNode_t *)0x0;
        lVar12 = (long)iVar8;
      }
      *(undefined8 *)(lVar12 * 8 + (long)__ptr_00) = 0;
      pBVar20->pRoot = pBVar21;
    } while (pBVar21 == (Bbr_ImageNode_t *)0x0);
    if (-1 < nParts) {
      uVar15 = 0;
      do {
        if (*(long *)((long)__ptr_00 + uVar15 * 8) != 0) {
          __assert_fail("pNodes[v] == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/bbr/bbrImage.c"
                        ,0xe2,
                        "Bbr_ImageTree_t *Bbr_bddImageStart(DdManager *, DdNode *, int, DdNode **, int, DdNode **, int, int)"
                       );
        }
        uVar15 = uVar15 + 1;
      } while (uVar28 != uVar15);
    }
    if (__ptr_00 != (void *)0x0) {
      free(__ptr_00);
    }
    pDVar10 = Cudd_Support(dd,bCare);
    pBVar20->bCareSupp = pDVar10;
    Cudd_Ref(pDVar10);
    Bbr_DeleteParts_rec(pBVar21);
  }
  else {
    if (0 < (int)uVar25) {
      lVar12 = 0;
      do {
        pvVar5 = *(void **)((long)__s + lVar12 * 8);
        if (pvVar5 != (void *)0x0) {
          free(pvVar5);
          *(undefined8 *)((long)__s + lVar12 * 8) = 0;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < dd->size);
    }
    if (__s != (void *)0x0) {
      free(__s);
    }
    if (-1 < nParts) {
      uVar15 = 0;
      do {
        pBVar21 = *(Bbr_ImageNode_t **)((long)__ptr_00 + uVar15 * 8);
        if (pBVar21 != (Bbr_ImageNode_t *)0x0) {
          Bbr_DeleteParts_rec(pBVar21);
          Bbr_bddImageTreeDelete_rec(pBVar21);
        }
        uVar15 = uVar15 + 1;
      } while (uVar28 != uVar15);
    }
    if (__ptr_00 != (void *)0x0) {
      free(__ptr_00);
    }
    pBVar20 = (Bbr_ImageTree_t *)0x0;
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return pBVar20;
}

Assistant:

Bbr_ImageTree_t * Bbr_bddImageStart( 
    DdManager * dd, DdNode * bCare, // the care set
    int nParts, DdNode ** pbParts,  // the partitions for image computation
    int nVars, DdNode ** pbVars, int nBddMax, int fVerbose )   // the NS and parameter variables (not quantified!)
{
    Bbr_ImageTree_t * pTree;
    Bbr_ImagePart_t ** pParts;
    Bbr_ImageVar_t ** pVars;
    Bbr_ImageNode_t ** pNodes, * pCare;
    int fStop, v;

    if ( fVerbose && dd->size <= 80 )
        Bbr_bddImagePrintLatchDependency( dd, bCare, nParts, pbParts, nVars, pbVars );

    // create variables, partitions and leaf nodes
    pParts = Bbr_CreateParts( dd, nParts, pbParts, bCare );
    pVars  = Bbr_CreateVars( dd, nParts + 1, pParts, nVars, pbVars );
    pNodes = Bbr_CreateNodes( dd, nParts + 1, pParts, dd->size, pVars );
    pCare  = pNodes[nParts];

    // process the nodes
    while ( Bbr_BuildTreeNode( dd, nParts + 1, pNodes, dd->size, pVars, &fStop, nBddMax ) );

    // consider the case of BDD node blowup
    if ( fStop )
    {
        for ( v = 0; v < dd->size; v++ )
            if ( pVars[v] )
                ABC_FREE( pVars[v] );
        ABC_FREE( pVars );
        for ( v = 0; v <= nParts; v++ )
            if ( pNodes[v] )
            {
                Bbr_DeleteParts_rec( pNodes[v] );
                Bbr_bddImageTreeDelete_rec( pNodes[v] );
            }
        ABC_FREE( pNodes );
        ABC_FREE( pParts );
        return NULL;
    }

    // make sure the variables are gone
    for ( v = 0; v < dd->size; v++ )
        assert( pVars[v] == NULL );
    ABC_FREE( pVars );
    
    // create the tree
    pTree = ABC_ALLOC( Bbr_ImageTree_t, 1 );
    memset( pTree, 0, sizeof(Bbr_ImageTree_t) );
    pTree->pCare = pCare;
    pTree->nBddMax = nBddMax;
    pTree->fVerbose = fVerbose;

    // merge the topmost nodes
    while ( (pTree->pRoot = Bbr_MergeTopNodes( dd, nParts + 1, pNodes )) == NULL );

    // make sure the nodes are gone
    for ( v = 0; v < nParts + 1; v++ )
        assert( pNodes[v] == NULL );
    ABC_FREE( pNodes );

//    if ( fVerbose )
//        Bbr_bddImagePrintTree( pTree );

    // set the support of the care set
    pTree->bCareSupp = Cudd_Support( dd, bCare );  Cudd_Ref( pTree->bCareSupp );

    // clean the partitions
    Bbr_DeleteParts_rec( pTree->pRoot );
    ABC_FREE( pParts );

    return pTree;
}